

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvAdvDiff_bnd.c
# Opt level: O2

int check_retval(int retval,char *funcname)

{
  undefined8 in_R8;
  undefined8 in_R9;
  
  if (-1 < retval) {
    return 0;
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",funcname,retval,in_R8,in_R9,0
         );
  return 1;
}

Assistant:

static int check_retval(int retval, const char* funcname)
{
  /* Check if retval < 0 */
  if (retval < 0)
  {
    fprintf(stderr, "\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",
            funcname, retval);
    return (1);
  }
  else { return (0); }
}